

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O3

void __thiscall
rengine::OpenGLRenderer::drawColorFilterQuad
          (OpenGLRenderer *this,uint offset,GLuint texId,mat4 matrix)

{
  int iVar1;
  Program *pPVar2;
  int iVar3;
  int iVar4;
  
  pPVar2 = this->m_activeShader;
  if ((anon_struct_16_2_8284188f_for_prog_colorFilter *)pPVar2 != &this->prog_colorFilter) {
    if (pPVar2 == (Program *)0x0) {
      iVar3 = 0;
    }
    else {
      iVar3 = (pPVar2->super_OpenGLShaderProgram).m_attributeCount;
    }
    iVar1 = (this->prog_colorFilter).super_Program.super_OpenGLShaderProgram.m_attributeCount;
    glUseProgram((this->prog_colorFilter).super_Program.super_OpenGLShaderProgram.m_id);
    iVar4 = iVar3;
    if (iVar3 < iVar1) {
      do {
        glEnableVertexAttribArray(iVar4);
        iVar4 = iVar4 + 1;
      } while (iVar1 != iVar4);
    }
    while (iVar1 < iVar3) {
      iVar3 = iVar3 + -1;
      glDisableVertexAttribArray(iVar3);
    }
    this->m_activeShader = &(this->prog_colorFilter).super_Program;
  }
  if ((this->m_matrixState & 0x10) != 0) {
    this->m_matrixState = this->m_matrixState & 0xffffffef;
    glUniformMatrix4fv((this->prog_colorFilter).super_Program.matrix,1,1,&this->m_proj);
  }
  glUniformMatrix4fv((this->prog_colorFilter).colorMatrix,1,1,&matrix);
  glVertexAttribPointer(0,2,0x1406,0,0,(ulong)offset << 3);
  glBindTexture(0xde1,texId);
  glDrawArrays(5,0,4);
  return;
}

Assistant:

inline void OpenGLRenderer::drawColorFilterQuad(unsigned offset, GLuint texId, mat4 matrix)
{
    activateShader(&prog_colorFilter);
    ensureMatrixUpdated(UpdateColorFilterProgram, &prog_colorFilter);
    glUniformMatrix4fv(prog_colorFilter.colorMatrix, 1, true, matrix.m);
    // std::cout << prog_colorFilter.colorMatrix << matrix;
    glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, (void *) (offset * sizeof(vec2)));
    glBindTexture(GL_TEXTURE_2D, texId);
    glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
}